

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

bool ON_Locale::ParseName
               (char *locale_name,int locale_name_element_count,char *language_code,
               size_t language_code_capacity,char *extlang_code,size_t extlang_code_capacity,
               char *script_code,size_t script_code_capacity,char *region_code,
               size_t region_code_capacity,char *sortorder,size_t sortorder_capacity)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  char *pcVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  ulong local_88;
  char *local_80;
  ulong local_60;
  byte *local_58;
  char *local_50;
  
  bVar16 = language_code_capacity != 0;
  local_80 = (char *)0x0;
  local_88 = 0;
  if (language_code != (char *)0x0 && bVar16) {
    memset(language_code,0,language_code_capacity);
    local_88 = language_code_capacity;
    local_80 = language_code;
  }
  bVar17 = extlang_code_capacity != 0;
  local_50 = (char *)0x0;
  uVar4 = 0;
  if (extlang_code != (char *)0x0 && bVar17) {
    memset(extlang_code,0,extlang_code_capacity);
    uVar4 = extlang_code_capacity;
    local_50 = extlang_code;
  }
  bVar18 = script_code_capacity != 0;
  local_58 = (byte *)0x0;
  uVar5 = 0;
  if (script_code != (char *)0x0 && bVar18) {
    memset(script_code,0,script_code_capacity);
    local_58 = (byte *)script_code;
    uVar5 = script_code_capacity;
  }
  bVar19 = region_code_capacity != 0;
  local_60 = 0;
  pcVar14 = (char *)0x0;
  if (region_code != (char *)0x0 && bVar19) {
    memset(region_code,0,region_code_capacity);
    local_60 = region_code_capacity;
    pcVar14 = region_code;
  }
  bVar20 = sortorder_capacity != 0;
  pcVar8 = (char *)0x0;
  uVar15 = 0;
  if (sortorder != (char *)0x0 && bVar20) {
    memset(sortorder,0,sortorder_capacity);
    pcVar8 = sortorder;
    uVar15 = sortorder_capacity;
  }
  if (((((language_code != (char *)0x0 && bVar16 || !bVar16) &&
        (extlang_code != (char *)0x0 && bVar17 || !bVar17)) &&
       (script_code != (char *)0x0 && bVar18 || !bVar18)) &&
      (region_code != (char *)0x0 && bVar19 || !bVar19)) &&
      (sortorder != (char *)0x0 && bVar20 || !bVar20)) {
    if (locale_name == (char *)0x0) {
      return true;
    }
    if (locale_name_element_count == 0) {
      return true;
    }
    if (*locale_name == '\0') {
      return true;
    }
    if (locale_name_element_count < 0) {
      locale_name_element_count = ON_String::Length(locale_name);
    }
    if (1 < locale_name_element_count) {
      pbVar6 = (byte *)(locale_name + -1);
      lVar9 = -1;
      do {
        pbVar1 = pbVar6 + 1;
        pbVar6 = pbVar6 + 1;
        lVar9 = lVar9 + 1;
      } while ((byte)((*pbVar1 & 0xdf) + 0xbf) < 0x1a);
      if (1 < lVar9) {
        for (uVar10 = 0; (uVar10 < local_88 && (locale_name + uVar10 < pbVar6)); uVar10 = uVar10 + 1
            ) {
          bVar3 = locale_name[uVar10];
          bVar11 = bVar3 + 0x20;
          if (0x19 < (byte)(bVar3 + 0xbf)) {
            bVar11 = bVar3;
          }
          local_80[uVar10] = bVar11;
        }
        if ((*local_80 != '\0') && (uVar7 = 0, local_80[1] != '\0')) {
          bVar3 = 1;
          bVar13 = 1;
          bVar16 = true;
          bVar11 = 1;
          do {
            bVar18 = 3 < uVar7;
            bVar17 = locale_name + (uint)locale_name_element_count <= pbVar6 || bVar18;
            if (bVar17) {
LAB_004e7ec1:
              return (bool)(bVar17 | bVar18);
            }
            bVar12 = *pbVar6;
            if (bVar12 == 0) {
              bVar18 = true;
              goto LAB_004e7ec1;
            }
            if ((bVar12 != 0x5f) && (bVar12 != 0x2d)) {
LAB_004e7e96:
              bVar18 = false;
              goto LAB_004e7ec1;
            }
            pbVar1 = pbVar6 + 1;
            uVar10 = 0;
            while ((pbVar2 = pbVar1 + uVar10, pbVar2 < locale_name + (uint)locale_name_element_count
                   && (((*pbVar2 & 0xfe) == 0x30 || ((byte)((*pbVar2 & 0xdf) + 0xbf) < 0x1a))))) {
              uVar10 = uVar10 + 1;
            }
            if ((long)uVar10 < 2) goto LAB_004e7e96;
            if (((((bool)(~bVar13 & 1) || uVar10 != 3) || (bVar12 != 0x2d)) ||
                (0x19 < (byte)((*pbVar1 & 0xdf) + 0xbf))) ||
               ((0x19 < (byte)((pbVar6[2] & 0xdf) + 0xbf) ||
                (0x19 < (byte)((pbVar6[3] & 0xdf) + 0xbf))))) {
              if (((((bool)(bVar3 & (uVar10 == 4 && bVar12 == 0x2d))) &&
                   ((bVar3 = *pbVar1, (byte)((bVar3 & 0xdf) + 0xbf) < 0x1a &&
                    ((byte)((pbVar6[2] & 0xdf) + 0xbf) < 0x1a)))) &&
                  ((byte)((pbVar6[3] & 0xdf) + 0xbf) < 0x1a)) &&
                 ((byte)((pbVar6[4] & 0xdf) + 0xbf) < 0x1a)) {
                if (uVar5 - 1 < 3) goto LAB_004e7e96;
                if (uVar5 == 0) {
                  bVar3 = 0;
                }
                else {
                  pbVar6 = pbVar6 + 2;
                  bVar13 = bVar3 - 0x20;
                  if (0x19 < (byte)(bVar3 + 0x9f)) {
                    bVar13 = bVar3;
                  }
                  *local_58 = bVar13;
                  uVar10 = 1;
                  while ((bVar3 = 0, uVar10 < uVar5 && (pbVar6 < pbVar2))) {
                    bVar3 = *pbVar6;
                    pbVar6 = pbVar6 + 1;
                    bVar13 = bVar3 + 0x20;
                    if (0x19 < (byte)(bVar3 + 0xbf)) {
                      bVar13 = bVar3;
                    }
                    local_58[uVar10] = bVar13;
                    uVar10 = uVar10 + 1;
                  }
                }
              }
              else {
                if (bVar16) {
                  if (bVar12 == 0x2d) {
                    if (uVar10 == 3) {
                      if ((((*pbVar1 & 0xfe) != 0x30) || ((pbVar6[2] & 0xfe) != 0x30)) ||
                         ((pbVar6[3] & 0xfe) != 0x30)) goto LAB_004e7e9a;
                    }
                    else {
                      if (uVar10 != 2) goto LAB_004e7e9a;
LAB_004e7d78:
                      if ((0x19 < (byte)((*pbVar1 & 0xdf) + 0xbf)) ||
                         (0x19 < (byte)((pbVar6[2] & 0xdf) + 0xbf))) goto LAB_004e7da0;
                    }
                    if (local_60 - 1 < uVar10) goto LAB_004e7e96;
                    for (uVar10 = 0; (bVar3 = 0, uVar10 < local_60 && (pbVar1 + uVar10 < pbVar2));
                        uVar10 = uVar10 + 1) {
                      bVar3 = pbVar1[uVar10];
                      bVar13 = bVar3 - 0x20;
                      if (0x19 < (byte)(bVar3 + 0x9f)) {
                        bVar13 = bVar3;
                      }
                      pcVar14[uVar10] = bVar13;
                    }
                    bVar16 = false;
                    goto LAB_004e7e71;
                  }
                  if (bVar12 == 0x5f && uVar10 == 2) goto LAB_004e7d78;
                }
LAB_004e7da0:
                if ((bool)(~bVar11 & 1 | bVar12 != 0x5f)) {
LAB_004e7e9a:
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                             ,0x310,"","Parser needs to be enhanced or input is not valid");
                  return false;
                }
                if (uVar15 - 1 < uVar10) goto LAB_004e7e96;
                for (uVar10 = 0; bVar3 = 0, uVar10 < uVar15; uVar10 = uVar10 + 1) {
                  bVar16 = false;
                  bVar11 = 0;
                  if (pbVar2 <= pbVar1 + uVar10) goto LAB_004e7e71;
                  pcVar8[uVar10] = pbVar1[uVar10];
                }
                bVar16 = false;
                bVar11 = 0;
              }
            }
            else {
              if (uVar4 - 1 < 2) goto LAB_004e7e96;
              if (uVar4 != 0) {
                for (uVar10 = 0; (uVar10 < uVar4 && (pbVar1 + uVar10 < pbVar2)); uVar10 = uVar10 + 1
                    ) {
                  bVar13 = pbVar1[uVar10];
                  bVar12 = bVar13 + 0x20;
                  if (0x19 < (byte)(bVar13 + 0xbf)) {
                    bVar12 = bVar13;
                  }
                  local_50[uVar10] = bVar12;
                }
              }
            }
LAB_004e7e71:
            uVar7 = uVar7 + 1;
            bVar13 = 0;
            pbVar6 = pbVar2;
          } while( true );
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Locale::ParseName(
  const char* locale_name,
  int locale_name_element_count,
  char* language_code,
  size_t language_code_capacity,
  char* extlang_code,
  size_t extlang_code_capacity,
  char* script_code,
  size_t script_code_capacity,
  char* region_code,
  size_t region_code_capacity,
  char* sortorder,
  size_t sortorder_capacity
  )
{
  bool rc = true;

  if ( false == ZeroCharBuffer(language_code, language_code_capacity, sizeof(language_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(extlang_code, extlang_code_capacity, sizeof(extlang_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(script_code,   script_code_capacity,   sizeof(script_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(region_code,   region_code_capacity,   sizeof(region_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(sortorder,     sortorder_capacity,     sizeof(sortorder[0])) )
    rc = false;

  if (!rc)
    return false;

  if ( nullptr == locale_name || 0 == locale_name[0] || 0 == locale_name_element_count )
    return true;

  if ( locale_name_element_count < 0 )
    locale_name_element_count = ON_String::Length(locale_name);

  if ( locale_name_element_count < 2 )
    return false;

  const char* locale_name_end = locale_name + locale_name_element_count;

  const char* s0 = locale_name;
  const char* s1 = s0;
  while( IsAlpha(*s1) )
    s1++;

  if ( s1-s0 < 2 )
    return false;

  for ( size_t i = 0; i < language_code_capacity && s0 < s1 ; i++)
    language_code[i] = ToLower(*s0++); // lower case for language code is a convention

  if ( 0 == language_code[0] || 0 == language_code[1] )
    return false;

  bool bScriptTest = true;
  bool bExtlangTest = true;
  bool bRegionTest = true;
  bool bSortOrderTest = true;

  for (int pass = 0; pass < 4 && s1 < locale_name_end; pass++)
  {
    char c0 = *s1;

    if (0 == c0)
      return true;

    if (false == IsHyphenOrUnderbar(c0))
      return false;

    s1++;
    s0 = s1;
    while (s1 < locale_name_end && IsAlphaOrDigit(*s1))
      s1++;

    if ( s1-s0 < 2 )
      return false;

    if (bExtlangTest)
    {
      bExtlangTest = false;
      if ( IsHyphen(c0)
        && 3 == s1 - s0
        && IsAlpha(s0[0])
        && IsAlpha(s0[1])
        && IsAlpha(s0[2])
        )
      {
        if ( extlang_code_capacity > 0 && extlang_code_capacity < (size_t)(s1-s0) )
          return false;
        if (extlang_code_capacity > 0)
        {
          for (size_t i = 0; i < extlang_code_capacity && s0 < s1; i++)
            extlang_code[i] = ToLower(*s0++); // lower case for extlang code is a convention
        }
        continue;
      }
    }

    if (bScriptTest)
    {
      bScriptTest = false;
      if ( IsHyphen(c0)
        && 4 == s1 - s0
        && IsAlpha(s0[0])
        && IsAlpha(s0[1])
        && IsAlpha(s0[2])
        && IsAlpha(s0[3])
        )
      {
        // ISO 15924 script code
        if ( script_code_capacity > 0 && script_code_capacity < (size_t)(s1-s0) )
          return false;
        if (script_code_capacity > 0)
        {
          // convention is for script codes is CAPITAL, small, small, small case
          script_code[0] = ToUpper(*s0++);
          for (size_t i = 1; i < script_code_capacity && s0 < s1; i++)
            script_code[i] = ToLower(*s0++);
        }
        continue;
      }
    }

    if (bRegionTest)
    {
      bRegionTest = false;
      // IsUnderbar(c0) is here to handle Apple OS X and iOS "locale id" names like "en_US" which use and underbar before region
      if (
        ( (IsHyphen(c0) || IsUnderbar(c0)) && 2 == s1 - s0 && IsAlpha(s0[0]) && IsAlpha(s0[1]) )  // ISO 3166 country/region identifier (2 alpha)
        || ( IsHyphen(c0) && 3 == s1 - s0 && IsDigit(s0[0]) && IsDigit(s0[1]) && IsDigit(s0[2]) ) // UN M.49 code (3 digits)
        )
      {
        if ( region_code_capacity > 0 && region_code_capacity <= (size_t)(s1-s0) )
          return false;
        for (size_t i = 0; i < region_code_capacity && s0 < s1; i++)
          region_code[i] = ToUpper(*s0++); // uppercase for regions is a convention
        continue;
      }
    }

    if (bSortOrderTest)
    {
      bSortOrderTest = false;
      if (IsUnderbar(c0))
      {
        // Windows sort order
        if (sortorder_capacity > 0 && sortorder_capacity <= (size_t)(s1 - s0))
          return false;
        for (size_t i = 0; i < sortorder_capacity && s0 < s1; i++)
          sortorder[i] = *s0++;
        continue;
      }
    }


    ON_ERROR("Parser needs to be enhanced or input is not valid");
    return false;
  }

  return true;

}